

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::t_formatter<spdlog::details::null_scoped_padder>::format
          (t_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char acStack_1b [3];
  char *local_18;
  
  local_18 = fmt::v6::format_int::format_decimal
                       ((format_int *)&stack0xffffffffffffffd0,msg->thread_id);
  lVar1 = (long)&stack0xffffffffffffffd0 - (long)local_18;
  if (-0x16 < lVar1) {
    fmt::v6::internal::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_18,local_18 + lVar1 + 0x15);
    return;
  }
  fmt::v6::internal::assert_fail(in_stack_ffffffffffffffd0,0,in_stack_ffffffffffffffc8);
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }